

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Areal_Object_State_PDU
          (Areal_Object_State_PDU *this,KUINT8 Modification,ObjectType *T,ArealObjectAppearance *A,
          SimulationIdentifier *RequestorID,SimulationIdentifier *ReceivingID,
          vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
          *Points)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT16 KVar4;
  uint uVar5;
  
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Areal_Object_State_PDU_002240c8;
  (this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__ObjectType_00225f90;
  KVar1 = T->m_ui8EntityKind;
  KVar2 = T->m_ui8Category;
  KVar3 = T->m_ui8SubCategory;
  (this->m_ObjTyp).m_ui8Domain = T->m_ui8Domain;
  (this->m_ObjTyp).m_ui8EntityKind = KVar1;
  (this->m_ObjTyp).m_ui8Category = KVar2;
  (this->m_ObjTyp).m_ui8SubCategory = KVar3;
  (this->m_Apperance).super_ObjectAppearance.m_GeneralAppearanceUnion =
       (A->super_ObjectAppearance).m_GeneralAppearanceUnion;
  (this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ArealObjectAppearance_00225000;
  *(undefined4 *)&(this->m_Apperance).super_ObjectAppearance.field_0xc =
       *(undefined4 *)&(A->super_ObjectAppearance).field_0xc;
  this->m_ui16NumPoints = 0;
  (this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_0021fd78;
  KVar4 = RequestorID->m_ui16ApplicationID;
  (this->m_ReqID).m_ui16SiteID = RequestorID->m_ui16SiteID;
  (this->m_ReqID).m_ui16ApplicationID = KVar4;
  (this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_0021fd78;
  KVar4 = ReceivingID->m_ui16ApplicationID;
  (this->m_RecvID).m_ui16SiteID = ReceivingID->m_ui16SiteID;
  (this->m_RecvID).m_ui16ApplicationID = KVar4;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = '-';
  (this->super_Object_State_Header).field_0x4b = Modification;
  uVar5 = (uint)(*(int *)&(Points->
                          super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(Points->
                         super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 5;
  this->m_ui16NumPoints = (KUINT16)uVar5;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength =
       (short)(uVar5 << 3) * 3 + 6;
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::operator=(&this->m_vPoints,Points);
  return;
}

Assistant:

Areal_Object_State_PDU::Areal_Object_State_PDU( KUINT8 Modification, const ObjectType & T, const ArealObjectAppearance & A,
        const SimulationIdentifier & RequestorID, const SimulationIdentifier & ReceivingID,
        const std::vector<WorldCoordinates> & Points ) :
    m_ObjTyp( T ),
    m_Apperance( A ),
    m_ui16NumPoints( 0 ),
    m_ReqID( RequestorID ),
    m_RecvID(ReceivingID )
{
    m_ui8PDUType = ArealObjectState_PDU_Type;
    m_ui16PDULength = AREAL_OBJECT_STATE_PDU_SIZE;
    m_ModificationUnion.m_ui8Modifications = Modification;

    SetPoints( Points );
}